

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::TypeofElem_Int32(Var instance,int32 index,ScriptContext *scriptContext)

{
  bool bVar1;
  BOOL BVar2;
  JavascriptLibrary *this;
  ScriptContext *scriptContext_local;
  int32 index_local;
  Var instance_local;
  undefined8 local_10;
  
  BVar2 = IsNumberFromNativeArray(instance,index,scriptContext);
  if (BVar2 == 0) {
    bVar1 = TaggedInt::IsOverflow(index);
    if (bVar1) {
      local_10 = JavascriptNumber::NewInlined((double)index,scriptContext);
    }
    else {
      local_10 = TaggedInt::ToVarUnchecked(index);
    }
    instance_local = TypeofElem(instance,local_10,scriptContext);
  }
  else {
    this = ScriptContext::GetLibrary(scriptContext);
    instance_local = JavascriptLibrary::GetNumberTypeDisplayString(this);
  }
  return instance_local;
}

Assistant:

Var JavascriptOperators::TypeofElem_Int32(Var instance, int32 index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofElem_Int32);
        if (JavascriptOperators::IsNumberFromNativeArray(instance, index, scriptContext))
            return scriptContext->GetLibrary()->GetNumberTypeDisplayString();

#if FLOATVAR
        return TypeofElem(instance, Js::JavascriptNumber::ToVar(index, scriptContext), scriptContext);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return TypeofElem(instance, Js::JavascriptNumber::ToVarInPlace(index, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext);
#endif
        JIT_HELPER_END(Op_TypeofElem_Int32);
    }